

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O3

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  int iVar2;
  uint uVar3;
  pointer pMVar4;
  size_t _elemsize;
  void *pvVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  pointer pMVar12;
  void *pvVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  void *__src;
  int iVar17;
  ulong local_a0;
  int local_98;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = pMVar4->dims;
  _elemsize = pMVar4->elemsize;
  pvVar5 = (this->slices).data;
  if (uVar7 == 1) {
    pMVar12 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar12;
    if (lVar8 != 0) {
      iVar2 = pMVar4->w;
      uVar9 = lVar8 >> 6;
      lVar8 = 0;
      lVar16 = 0;
      iVar14 = 0;
      uVar11 = 0;
      do {
        iVar10 = *(int *)((long)pvVar5 + uVar11 * 4);
        if (iVar10 == -0xe9) {
          iVar10 = (int)((ulong)((long)iVar2 - (long)iVar14) / (uVar9 + lVar16));
        }
        Mat::create((Mat *)((long)&pMVar12->data + lVar8),iVar10,_elemsize,opt->blob_allocator);
        pvVar13 = *(void **)((long)&pMVar12->data + lVar8);
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar12->c + lVar8) * *(long *)((long)&pMVar12->cstep + lVar8) ==
            0) {
          return -100;
        }
        memcpy(pvVar13,(void *)((long)iVar14 * 4 + (long)pMVar4->data),(long)iVar10 * _elemsize);
        iVar14 = iVar14 + iVar10;
        uVar11 = uVar11 + 1;
        pMVar12 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar12 >> 6;
        lVar16 = lVar16 + -1;
        lVar8 = lVar8 + 0x40;
      } while (uVar11 < uVar9);
    }
  }
  else {
    uVar3 = this->axis;
    if ((uVar7 ^ 2) == 0 && uVar3 == 0) {
      pMVar12 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar12;
      if (lVar8 != 0) {
        iVar2 = pMVar4->w;
        iVar14 = pMVar4->h;
        uVar9 = lVar8 >> 6;
        lVar8 = 0;
        lVar16 = 0;
        iVar10 = 0;
        uVar11 = 0;
        do {
          iVar15 = *(int *)((long)pvVar5 + uVar11 * 4);
          if (iVar15 == -0xe9) {
            iVar15 = (int)((ulong)((long)iVar14 - (long)iVar10) / (uVar9 + lVar16));
          }
          Mat::create((Mat *)((long)&pMVar12->data + lVar8),iVar2,iVar15,_elemsize,
                      opt->blob_allocator);
          pvVar13 = *(void **)((long)&pMVar12->data + lVar8);
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)*(int *)((long)&pMVar12->c + lVar8) * *(long *)((long)&pMVar12->cstep + lVar8)
              == 0) {
            return -100;
          }
          memcpy(pvVar13,(void *)((long)pMVar4->w * (long)iVar10 * pMVar4->elemsize +
                                 (long)pMVar4->data),(long)(iVar15 * iVar2) * _elemsize);
          iVar10 = iVar10 + iVar15;
          uVar11 = uVar11 + 1;
          pMVar12 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar12 >> 6;
          lVar16 = lVar16 + -1;
          lVar8 = lVar8 + 0x40;
        } while (uVar11 < uVar9);
      }
    }
    else if ((uVar7 ^ 2) == 0 && (uVar3 ^ 1) == 0) {
      pMVar12 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar12;
      if (lVar8 != 0) {
        iVar2 = pMVar4->w;
        iVar14 = pMVar4->h;
        uVar9 = lVar8 >> 6;
        iVar10 = 0;
        uVar11 = 0;
        do {
          iVar15 = *(int *)((long)pvVar5 + uVar11 * 4);
          if (iVar15 == -0xe9) {
            iVar15 = (int)((ulong)((long)iVar2 - (long)iVar10) / (uVar9 - uVar11));
          }
          pMVar1 = pMVar12 + uVar11;
          Mat::create(pMVar1,iVar15,iVar14,_elemsize,opt->blob_allocator);
          if (pMVar12[uVar11].data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          if (0 < iVar14) {
            iVar17 = 0;
            do {
              memcpy((void *)((long)pMVar1->w * (long)iVar17 * pMVar1->elemsize + (long)pMVar1->data
                             ),
                     (void *)((long)pMVar4->data +
                             (long)iVar10 * 4 + (long)pMVar4->w * (long)iVar17 * pMVar4->elemsize),
                     (long)iVar15 * _elemsize);
              iVar17 = iVar17 + 1;
            } while (iVar14 != iVar17);
          }
          iVar10 = iVar10 + iVar15;
          uVar11 = uVar11 + 1;
          pMVar12 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar12 >> 6;
        } while (uVar11 < uVar9);
        return 0;
      }
    }
    else {
      uVar7 = uVar7 ^ 3;
      if (uVar7 == 0 && uVar3 == 0) {
        pMVar12 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar12;
        if (lVar8 != 0) {
          iVar2 = pMVar4->w;
          iVar14 = pMVar4->h;
          iVar10 = pMVar4->c;
          uVar9 = lVar8 >> 6;
          lVar8 = 0;
          local_a0 = 0;
          iVar15 = 0;
          uVar11 = 0;
          do {
            iVar17 = *(int *)((long)pvVar5 + uVar11 * 4);
            if (iVar17 == -0xe9) {
              iVar17 = (int)((ulong)((long)iVar10 - (long)iVar15) / (uVar9 + local_a0));
            }
            Mat::create((Mat *)((long)&pMVar12->data + lVar8),iVar2,iVar14,iVar17,_elemsize,
                        opt->blob_allocator);
            pvVar13 = *(void **)((long)&pMVar12->data + lVar8);
            if (pvVar13 == (void *)0x0) {
              return -100;
            }
            if ((long)*(int *)((long)&pMVar12->c + lVar8) * *(long *)((long)&pMVar12->cstep + lVar8)
                == 0) {
              return -100;
            }
            memcpy(pvVar13,(void *)(pMVar4->cstep * (long)iVar15 * pMVar4->elemsize +
                                   (long)pMVar4->data),
                   (long)(iVar17 * (int)pMVar4->cstep) * _elemsize);
            iVar15 = iVar15 + iVar17;
            uVar11 = uVar11 + 1;
            pMVar12 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar12 >> 6;
            local_a0 = local_a0 + -1;
            lVar8 = lVar8 + 0x40;
          } while (uVar11 < uVar9);
          return 0;
        }
      }
      else {
        if ((uVar3 ^ 1) != 0 || uVar7 != 0) {
          if (uVar7 != 0 || uVar3 != 2) {
            return 0;
          }
          pMVar12 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar12;
          if (lVar8 == 0) {
            return 0;
          }
          iVar2 = pMVar4->w;
          uVar7 = pMVar4->h;
          uVar3 = pMVar4->c;
          uVar9 = lVar8 >> 6;
          uVar11 = 0;
          iVar14 = 0;
          do {
            iVar10 = *(int *)((long)pvVar5 + uVar11 * 4);
            if (iVar10 == -0xe9) {
              iVar10 = (int)((ulong)((long)iVar2 - (long)iVar14) / (uVar9 - uVar11));
            }
            pMVar1 = pMVar12 + uVar11;
            Mat::create(pMVar1,iVar10,uVar7,uVar3,_elemsize,opt->blob_allocator);
            if (pMVar12[uVar11].data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar1->c * pMVar1->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar3) {
              local_a0 = 0;
              do {
                if (0 < (int)uVar7) {
                  sVar6 = pMVar4->elemsize;
                  iVar15 = pMVar4->w;
                  __src = (void *)((long)pMVar4->data +
                                  sVar6 * pMVar4->cstep * local_a0 + (long)iVar14 * 4);
                  pvVar13 = (void *)(pMVar1->cstep * pMVar1->elemsize * local_a0 +
                                    (long)pMVar1->data);
                  uVar9 = (ulong)uVar7;
                  do {
                    memcpy(pvVar13,__src,_elemsize * (long)iVar10);
                    __src = (void *)((long)__src + (long)iVar15 * sVar6);
                    pvVar13 = (void *)((long)pvVar13 + (long)iVar10 * 4);
                    uVar9 = uVar9 - 1;
                  } while (uVar9 != 0);
                }
                local_a0 = local_a0 + 1;
              } while (local_a0 != uVar3);
            }
            iVar14 = iVar14 + iVar10;
            uVar11 = uVar11 + 1;
            pMVar12 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar12 >> 6;
          } while (uVar11 < uVar9);
          return 0;
        }
        pMVar12 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar12;
        if (lVar8 != 0) {
          iVar2 = pMVar4->w;
          uVar7 = pMVar4->c;
          iVar14 = pMVar4->h;
          uVar9 = lVar8 >> 6;
          uVar11 = 0;
          local_98 = 0;
          do {
            iVar10 = *(int *)((long)pvVar5 + uVar11 * 4);
            if (iVar10 == -0xe9) {
              iVar10 = (int)((ulong)((long)iVar14 - (long)local_98) / (uVar9 - uVar11));
            }
            pMVar1 = pMVar12 + uVar11;
            Mat::create(pMVar1,iVar2,iVar10,uVar7,_elemsize,opt->blob_allocator);
            if (pMVar12[uVar11].data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar1->c * pMVar1->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar7) {
              uVar9 = 0;
              do {
                memcpy((void *)(pMVar1->cstep * uVar9 * pMVar1->elemsize + (long)pMVar1->data),
                       (void *)((long)pMVar4->data +
                               (long)pMVar4->w * (long)local_98 * pMVar4->elemsize +
                               pMVar4->cstep * uVar9 * pMVar4->elemsize),
                       (long)(iVar10 * iVar2) * _elemsize);
                uVar9 = uVar9 + 1;
              } while (uVar7 != uVar9);
            }
            local_98 = local_98 + iVar10;
            uVar11 = uVar11 + 1;
            pMVar12 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar12 >> 6;
          } while (uVar11 < uVar9);
          return 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;

    if (dims == 1) // axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const float* ptr = bottom_blob.row(q);
            float* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j=0; j<h; j++)
            {
                float* outptr = top_blob.row(j);
                const float* ptr = bottom_blob.row(j) + q;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = bottom_blob.cstep * slice;

            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                int size = w * slice;

                float* outptr = top_blob.channel(p);
                const float* ptr = bottom_blob.channel(p).row(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                float* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j=0; j<h; j++)
                {
                    const float* ptr = m.row(j) + q;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}